

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O2

dec_proc2_output __thiscall
sophia_interface::dec_proc2(sophia_interface *this,double x,int IRES,int L0)

{
  int LA;
  int LB;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  dec_proc2_output extraout_RAX;
  runtime_error *prVar6;
  int in_ECX;
  double *pdVar7;
  int *piVar8;
  int extraout_EDX;
  long lVar9;
  ulong uVar10;
  sophia_interface *this_00;
  int in_R8D;
  uint uVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  ulong uStack_120;
  runtime_error local_118 [16];
  runtime_error local_108 [16];
  runtime_error local_f8 [16];
  runtime_error local_e8 [16];
  runtime_error local_d8 [16];
  runtime_error local_c8 [16];
  runtime_error local_b8 [16];
  runtime_error local_a8 [16];
  runtime_error local_98 [16];
  runtime_error local_88 [16];
  runtime_error local_78 [16];
  runtime_error local_68 [16];
  runtime_error local_58 [16];
  runtime_error local_48 [16];
  undefined1 local_38 [24];
  
  local_38._16_8_ = x;
  if (L0 == 0xe) {
    dVar13 = RNDM(this);
    lVar5 = (long)IRES + -1;
    if (*(int *)(&DAT_0012fbbc + (long)IRES * 4) < 1) {
LAB_00108d73:
      uVar3 = IDBRES1n[lVar5];
      if (uVar3 == 0) {
        local_38._16_8_ = dVar13;
        std::runtime_error::runtime_error(local_a8,"invalid resonance in this energy range");
        std::runtime_error::~runtime_error(local_a8);
        dVar13 = (double)local_38._16_8_;
      }
      pdVar7 = CBRRES1n + (int)(uVar3 - 1);
      uVar2 = 0xffffffff;
      dVar14 = 0.0;
      do {
        uVar11 = uVar3;
        bVar1 = dVar14 <= dVar13;
        dVar14 = *pdVar7;
        uVar3 = uVar2;
        if (bVar1) {
          uVar3 = uVar11;
        }
        if (dVar14 <= dVar13) {
          uVar3 = uVar2;
        }
        uVar2 = uVar3;
        pdVar7 = pdVar7 + 1;
        uVar3 = uVar11 + 1;
      } while (dVar14 < 1.0);
      if (dVar13 != 1.0) {
        uVar11 = uVar2;
      }
      if (NAN(dVar13)) {
        uVar11 = uVar2;
      }
      if (uVar11 != 0xffffffff) goto LAB_00108ed0;
      prVar6 = local_98;
      goto LAB_00108eed;
    }
    lVar9 = (long)((int)lVar5 * 4);
    uStack_120 = 0;
    for (uVar10 = 1;
        (long)(lVar9 + uVar10) <=
        (long)(*(int *)(&DAT_0012fbbc + (long)IRES * 4) + (int)lVar5 * 4 + -1); uVar10 = uVar10 + 1)
    {
      if (((double)local_38._16_8_ <= RESLIMn[lVar9 + uVar10]) &&
         (pdVar7 = (double *)(lVar9 * 8 + 0x12fa68 + uVar10 * 8),
         *pdVar7 <= (double)local_38._16_8_ && (double)local_38._16_8_ != *pdVar7)) {
        uStack_120 = uVar10 & 0xffffffff;
      }
    }
    iVar12 = (int)uStack_120;
    if (iVar12 == 3) {
      uVar3 = IDBRES3n[lVar5];
      if (uVar3 == 0) {
        local_38._16_8_ = dVar13;
        std::runtime_error::runtime_error(local_68,"invalid resonance in this energy range");
        std::runtime_error::~runtime_error(local_68);
        dVar13 = (double)local_38._16_8_;
      }
      pdVar7 = CBRRES3n + (int)(uVar3 - 1);
      dVar14 = 0.0;
      uVar2 = 0xffffffff;
      do {
        uVar11 = uVar3;
        bVar1 = dVar14 <= dVar13;
        dVar14 = *pdVar7;
        uVar4 = uVar2;
        if (bVar1) {
          uVar4 = uVar11;
        }
        if (dVar14 <= dVar13) {
          uVar4 = uVar2;
        }
        pdVar7 = pdVar7 + 1;
        uVar3 = uVar11 + 1;
        uVar2 = uVar4;
      } while (dVar14 < 1.0);
      if (dVar13 != 1.0) {
        uVar11 = uVar4;
      }
      if (NAN(dVar13)) {
        uVar11 = uVar4;
      }
      if (uVar11 != 0xffffffff) {
LAB_00109191:
        uStack_120 = 0x300000000;
        goto LAB_001091f9;
      }
      prVar6 = local_58;
LAB_001091dd:
      std::runtime_error::runtime_error(prVar6,"no resonance decay possible !");
      uStack_120 = 3;
    }
    else if (iVar12 == 2) {
      uVar3 = IDBRES2n[lVar5];
      if (uVar3 == 0) {
        local_38._16_8_ = dVar13;
        std::runtime_error::runtime_error(local_88,"invalid resonance in this energy range");
        std::runtime_error::~runtime_error(local_88);
        dVar13 = (double)local_38._16_8_;
      }
      pdVar7 = CBRRES2n + (int)(uVar3 - 1);
      dVar14 = 0.0;
      uVar2 = 0xffffffff;
      do {
        uVar11 = uVar3;
        bVar1 = dVar14 <= dVar13;
        dVar14 = *pdVar7;
        uVar4 = uVar2;
        if (bVar1) {
          uVar4 = uVar11;
        }
        if (dVar14 <= dVar13) {
          uVar4 = uVar2;
        }
        pdVar7 = pdVar7 + 1;
        uVar3 = uVar11 + 1;
        uVar2 = uVar4;
      } while (dVar14 < 1.0);
      if (dVar13 != 1.0) {
        uVar11 = uVar4;
      }
      if (NAN(dVar13)) {
        uVar11 = uVar4;
      }
      if (uVar11 != 0xffffffff) {
LAB_001090de:
        uStack_120 = 0x200000000;
        goto LAB_001091f9;
      }
      prVar6 = local_78;
LAB_001091c3:
      std::runtime_error::runtime_error(prVar6,"no resonance decay possible !");
      uStack_120 = 2;
    }
    else {
      if (iVar12 == 1) goto LAB_00108d73;
      prVar6 = local_48;
LAB_001091ab:
      std::runtime_error::runtime_error(prVar6,"invalid IRANGE in DEC_PROC2");
    }
  }
  else {
    if (L0 != 0xd) {
      iVar12 = 0x129fc2;
      this_00 = (sophia_interface *)local_38;
      std::runtime_error::runtime_error((runtime_error *)this_00,"no valid L0 in DEC_PROC !");
      dVar13 = (double)std::runtime_error::~runtime_error((runtime_error *)this_00);
      this_00->np = 2;
      if (in_R8D == 0xe) {
        if (in_ECX == 3) {
          lVar5 = (long)(extraout_EDX * 5 + -3);
          piVar8 = KDECRES3n;
        }
        else if (in_ECX == 2) {
          lVar5 = (long)(extraout_EDX * 5 + -3);
          piVar8 = KDECRES2n;
        }
        else {
          if (in_ECX != 1) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"error in RES_DECAY3");
            goto LAB_001093a8;
          }
          lVar5 = (long)(extraout_EDX * 5 + -3);
          piVar8 = KDECRES1n;
        }
      }
      else {
        if (in_R8D != 0xd) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"no valid L0 in RES_DECAY3");
LAB_001093a8:
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (in_ECX == 3) {
          lVar5 = (long)(extraout_EDX * 5 + -3);
          piVar8 = KDECRES3p;
        }
        else if (in_ECX == 2) {
          lVar5 = (long)(extraout_EDX * 5 + -3);
          piVar8 = KDECRES2p;
        }
        else {
          if (in_ECX != 1) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"error in RES_DECAY3");
            goto LAB_001093a8;
          }
          lVar5 = (long)(extraout_EDX * 5 + -3);
          piVar8 = KDECRES1p;
        }
      }
      LA = piVar8[lVar5];
      LB = piVar8[extraout_EDX * 5 + -2];
      this_00->LLIST[0] = LA;
      this_00->LLIST[1] = LB;
      dVar14 = scatterangle(this_00,iVar12,in_R8D);
      if (dVar13 < 0.0) {
        dVar13 = sqrt(dVar13);
      }
      else {
        dVar13 = SQRT(dVar13);
      }
      PROC_TWOPART(this_00,LA,LB,dVar13,dVar14);
      return extraout_RAX;
    }
    dVar13 = RNDM(this);
    iVar12 = *(int *)((long)RESLIMn + (long)IRES * 4 + 0x11c);
    lVar5 = (long)IRES + -1;
    if (0 < iVar12) {
      lVar9 = (long)((int)lVar5 * 4);
      uStack_120 = 0;
      for (uVar10 = 1; (long)(lVar9 + uVar10) <= (long)(iVar12 + (int)lVar5 * 4 + -1);
          uVar10 = uVar10 + 1) {
        if (((double)local_38._16_8_ <= RESLIMp[lVar9 + uVar10]) &&
           (pdVar7 = (double *)(lVar9 * 8 + 0x12f948 + uVar10 * 8),
           *pdVar7 <= (double)local_38._16_8_ && (double)local_38._16_8_ != *pdVar7)) {
          uStack_120 = uVar10 & 0xffffffff;
        }
      }
      iVar12 = (int)uStack_120;
      if (iVar12 == 3) {
        uVar3 = IDBRES3p[lVar5];
        if (uVar3 == 0) {
          local_38._16_8_ = dVar13;
          std::runtime_error::runtime_error(local_d8,"invalid resonance in energy range 3");
          std::runtime_error::~runtime_error(local_d8);
          dVar13 = (double)local_38._16_8_;
        }
        pdVar7 = CBRRES3p + (int)(uVar3 - 1);
        dVar14 = 0.0;
        uVar2 = 0xffffffff;
        do {
          uVar11 = uVar3;
          bVar1 = dVar14 <= dVar13;
          dVar14 = *pdVar7;
          uVar4 = uVar2;
          if (bVar1) {
            uVar4 = uVar11;
          }
          if (dVar14 <= dVar13) {
            uVar4 = uVar2;
          }
          pdVar7 = pdVar7 + 1;
          uVar3 = uVar11 + 1;
          uVar2 = uVar4;
        } while (dVar14 < 1.0);
        if (dVar13 != 1.0) {
          uVar11 = uVar4;
        }
        if (NAN(dVar13)) {
          uVar11 = uVar4;
        }
        if (uVar11 != 0xffffffff) goto LAB_00109191;
        prVar6 = local_c8;
        goto LAB_001091dd;
      }
      if (iVar12 == 2) {
        uVar3 = IDBRES2p[lVar5];
        if (uVar3 == 0) {
          local_38._16_8_ = dVar13;
          std::runtime_error::runtime_error(local_f8,"invalid resonance in energy range 2");
          std::runtime_error::~runtime_error(local_f8);
          dVar13 = (double)local_38._16_8_;
        }
        pdVar7 = CBRRES2p + (int)(uVar3 - 1);
        dVar14 = 0.0;
        uVar2 = 0xffffffff;
        do {
          uVar11 = uVar3;
          bVar1 = dVar14 <= dVar13;
          dVar14 = *pdVar7;
          uVar4 = uVar2;
          if (bVar1) {
            uVar4 = uVar11;
          }
          if (dVar14 <= dVar13) {
            uVar4 = uVar2;
          }
          pdVar7 = pdVar7 + 1;
          uVar3 = uVar11 + 1;
          uVar2 = uVar4;
        } while (dVar14 < 1.0);
        if (dVar13 != 1.0) {
          uVar11 = uVar4;
        }
        if (NAN(dVar13)) {
          uVar11 = uVar4;
        }
        if (uVar11 != 0xffffffff) goto LAB_001090de;
        prVar6 = local_e8;
        goto LAB_001091c3;
      }
      if (iVar12 != 1) {
        prVar6 = local_b8;
        goto LAB_001091ab;
      }
    }
    uVar3 = IDBRES1p[lVar5];
    if (uVar3 == 0) {
      local_38._16_8_ = dVar13;
      std::runtime_error::runtime_error(local_118,"invalid resonance in energy range 1");
      std::runtime_error::~runtime_error(local_118);
      dVar13 = (double)local_38._16_8_;
    }
    pdVar7 = CBRRES1p + (int)(uVar3 - 1);
    dVar14 = 0.0;
    uVar2 = 0xffffffff;
    do {
      uVar11 = uVar3;
      bVar1 = dVar14 <= dVar13;
      dVar14 = *pdVar7;
      uVar4 = uVar2;
      if (bVar1) {
        uVar4 = uVar11;
      }
      if (dVar14 <= dVar13) {
        uVar4 = uVar2;
      }
      pdVar7 = pdVar7 + 1;
      uVar3 = uVar11 + 1;
      uVar2 = uVar4;
    } while (dVar14 < 1.0);
    if (dVar13 != 1.0) {
      uVar11 = uVar4;
    }
    if (NAN(dVar13)) {
      uVar11 = uVar4;
    }
    if (uVar11 != 0xffffffff) {
LAB_00108ed0:
      uStack_120 = 0x100000000;
      goto LAB_001091f9;
    }
    prVar6 = local_108;
LAB_00108eed:
    std::runtime_error::runtime_error(prVar6,"no resonance decay possible !");
    uStack_120 = 1;
  }
  std::runtime_error::~runtime_error(prVar6);
  uStack_120 = uStack_120 << 0x20;
  uVar11 = 0xffffffff;
LAB_001091f9:
  return (dec_proc2_output)(uVar11 | uStack_120);
}

Assistant:

dec_proc2_output sophia_interface::dec_proc2(double x, int IRES, int L0) {
// decide which decay with ID=IPROC of resonance IRES takes place ***
// Date: 20/01/98   **
// correct.: 27/04/98*
// author: A.Muecke **
    int IPROC = 0;
    int IRANGE = 0;
    double prob_sum[10] = {0.};

    // choose arrays /S_RESp/ for charged resonances,
    //        arrays /S_RESn/ for neutral resonances
    if (L0 == 13) {
        // charged resonances:
        double r = RNDM();
        // determine the energy range of the resonance:
        int nlim = ELIMITSp[IRES - 1];
        int istart = (IRES - 1) * 4 + 1;
        if (nlim > 0) {
            for (int ie = istart; ie < nlim - 2 + istart + 1; ++ie) {
                double reslimp1 = RESLIMp[ie - 1];
                double reslimp2 = RESLIMp[ie];
                if (x <= reslimp2 && x > reslimp1) {
                    IRANGE = ie + 1 - istart;
                }
            }
        } else {
            IRANGE = 1;
        }

        IPROC = -1;
        int i = 0;
        int j = 0;
        prob_sum[0] = 0.;
        if (IRANGE == 1) {
            j = IDBRES1p[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in energy range 1");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES1p[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else if (IRANGE == 2) {
            j = IDBRES2p[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in energy range 2");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES2p[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else if (IRANGE == 3) {
            j = IDBRES3p[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in energy range 3");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES3p[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else {
            std::runtime_error("invalid IRANGE in DEC_PROC2");
        }
        
        // output
        dec_proc2_output dpo;
        dpo.IPROC = IPROC;
        dpo.IRANGE = IRANGE;
        return dpo;
    } else if (L0 == 14) {
        // neutral resonances:
        double r = RNDM();
        //determine the energy range of the resonance:
        int nlim = ELIMITSn[IRES - 1];
        int istart = (IRES-1) * 4 + 1;
        if (nlim > 0) {
            for (int ie = istart; ie < nlim - 2 + istart + 1; ++ie) {
                if (x <= RESLIMn[ie] && x > RESLIMn[ie - 1]) {
                    IRANGE = ie + 1 - istart;
                }
            }
        } else {
            IRANGE = 1;
        }
        IPROC = -1;
        int i = 0;
        int j = 0;
        prob_sum[0] = 0.;
        if (IRANGE == 1) {
            j = IDBRES1n[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in this energy range");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES1n[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
                if (r == 1.) IPROC = j;
                if (IPROC == -1) {
                    std::runtime_error("no resonance decay possible !");
                }
        } else if (IRANGE == 2) {
            j = IDBRES2n[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in this energy range");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES2n[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else if (IRANGE == 3) {
            j = IDBRES3n[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in this energy range");
            }
            do {
                j++;
                i++;
                    prob_sum[i] = CBRRES3n[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else {
            std::runtime_error("invalid IRANGE in DEC_PROC2");
        }
        // output
        dec_proc2_output dpo;
        dpo.IPROC = IPROC;
        dpo.IRANGE = IRANGE;
        return dpo;
    } else {
        std::runtime_error("no valid L0 in DEC_PROC !");
    }    
}